

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int nghttp2_hd_inflate_new2(nghttp2_hd_inflater **inflater_ptr,nghttp2_mem *mem)

{
  int iVar1;
  nghttp2_hd_inflater *inflater;
  
  if (mem == (nghttp2_mem *)0x0) {
    mem = nghttp2_mem_default();
  }
  inflater = (nghttp2_hd_inflater *)nghttp2_mem_malloc(mem,0xf0);
  if (inflater == (nghttp2_hd_inflater *)0x0) {
    iVar1 = -0x385;
  }
  else {
    iVar1 = nghttp2_hd_inflate_init(inflater,mem);
    if (iVar1 == 0) {
      *inflater_ptr = inflater;
      iVar1 = 0;
    }
    else {
      nghttp2_mem_free(mem,inflater);
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_hd_inflate_new2(nghttp2_hd_inflater **inflater_ptr,
                            nghttp2_mem *mem) {
  int rv;
  nghttp2_hd_inflater *inflater;

  if (mem == NULL) {
    mem = nghttp2_mem_default();
  }

  inflater = nghttp2_mem_malloc(mem, sizeof(nghttp2_hd_inflater));

  if (inflater == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  rv = nghttp2_hd_inflate_init(inflater, mem);

  if (rv != 0) {
    nghttp2_mem_free(mem, inflater);

    return rv;
  }

  *inflater_ptr = inflater;

  return 0;
}